

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

ZSTD_useRowMatchFinderMode_e
ZSTD_resolveRowMatchFinderMode
          (ZSTD_useRowMatchFinderMode_e mode,ZSTD_compressionParameters *cParams)

{
  if (mode != ZSTD_urm_auto) {
    return mode;
  }
  if (cParams->strategy - ZSTD_btlazy2 < 0xfffffffd) {
    return ZSTD_urm_disableRowMatchFinder;
  }
  return ZSTD_urm_enableRowMatchFinder - (cParams->windowLog < 0xf);
}

Assistant:

static ZSTD_useRowMatchFinderMode_e ZSTD_resolveRowMatchFinderMode(ZSTD_useRowMatchFinderMode_e mode,
                                                                   const ZSTD_compressionParameters* const cParams) {
#if !defined(ZSTD_NO_INTRINSICS) && (defined(__SSE2__) || defined(__ARM_NEON))
    int const kHasSIMD128 = 1;
#else
    int const kHasSIMD128 = 0;
#endif
    if (mode != ZSTD_urm_auto) return mode; /* if requested enabled, but no SIMD, we still will use row matchfinder */
    mode = ZSTD_urm_disableRowMatchFinder;
    if (!ZSTD_rowMatchFinderSupported(cParams->strategy)) return mode;
    if (kHasSIMD128) {
        if (cParams->windowLog > 14) mode = ZSTD_urm_enableRowMatchFinder;
    } else {
        if (cParams->windowLog > 17) mode = ZSTD_urm_enableRowMatchFinder;
    }
    return mode;
}